

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWRaster.cpp
# Opt level: O3

void __thiscall
TRM::SWRaster::sweep_hline(SWRaster *this,int32_t x,int32_t y,int32_t area,int32_t count)

{
  pointer *ppSVar1;
  iterator __position;
  uint uVar2;
  uint uVar3;
  Span span;
  Span local_10;
  
  uVar3 = area >> 9;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  if (this->even_odd == true) {
    uVar2 = uVar2 & 0x1ff;
    if (0x100 < uVar2) {
      local_10.cover = 0x200 - uVar2;
      goto LAB_00116bb5;
    }
    local_10.cover = 0xff;
    if (uVar2 == 0x100) goto LAB_00116bb5;
  }
  else if (0xfe < uVar2) {
    uVar2 = 0xff;
  }
  local_10.cover = uVar2;
  if (uVar2 == 0) {
    return;
  }
LAB_00116bb5:
  __position._M_current =
       (this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (((((this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
         super__Vector_impl_data._M_start != __position._M_current) &&
       (__position._M_current[-1].y == y)) &&
      (__position._M_current[-1].x + __position._M_current[-1].len == x)) &&
     (__position._M_current[-1].cover == local_10.cover)) {
    __position._M_current[-1].len = __position._M_current[-1].len + count;
    return;
  }
  if (__position._M_current ==
      (this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_10.x = x;
    local_10.y = y;
    local_10.len = count;
    std::vector<TRM::Span,std::allocator<TRM::Span>>::_M_realloc_insert<TRM::Span&>
              ((vector<TRM::Span,std::allocator<TRM::Span>> *)&this->m_spans,__position,&local_10);
  }
  else {
    (__position._M_current)->x = x;
    (__position._M_current)->y = y;
    (__position._M_current)->len = count;
    (__position._M_current)->cover = local_10.cover;
    ppSVar1 = &(this->m_spans).super__Vector_base<TRM::Span,_std::allocator<TRM::Span>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  return;
}

Assistant:

void SWRaster::sweep_hline(int32_t x, int32_t y, int32_t area, int32_t count) {
  /* compute the coverage line's coverage, depending on the    */
  /* outline fill rule                                         */
  /*                                                           */
  /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
  /*                                                           */
  int32_t coverage = static_cast<int32_t>(area >> (PIXEL_BITS * 2 + 1 - 8));
  // use range [0, 256]
  if (coverage < 0) {
    coverage = -coverage;
  }

  if (this->even_odd) {
    coverage &= 511;
    if (coverage > 256)
      coverage = 512 - coverage;
    else if (coverage == 256)
      coverage = 255;
  } else {
    if (coverage >= 256) coverage = 255;
  }

  x = std::min(x, std::numeric_limits<int32_t>::max());
  y = std::min(y, std::numeric_limits<int32_t>::max());

  if (coverage) {
    if (!m_spans.empty()) {
      auto p_span = &m_spans.back();
      if (p_span->y == y && p_span->x + p_span->len == x &&
          p_span->cover == coverage) {
        p_span->len = p_span->len + count;
        return;
      }
    }

    Span span;
    span.x = x;
    span.y = y;
    span.len = count;
    span.cover = coverage;

    m_spans.emplace_back(span);
  }
}